

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>::~ShaderVariableManagerBase
          (ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void> *this)

{
  string msg;
  string local_20;
  
  if (this->m_pVariables != (void *)0x0) {
    FormatString<char[69]>
              (&local_20,
               (char (*) [69])"Destroy() has not been called. The shader variable memory will leak."
              );
    DebugAssertionFailed
              (local_20._M_dataplus._M_p,"~ShaderVariableManagerBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x340);
    std::__cxx11::string::~string((string *)&local_20);
  }
  return;
}

Assistant:

~ShaderVariableManagerBase()
    {
        VERIFY(m_pVariables == nullptr, "Destroy() has not been called. The shader variable memory will leak.");
    }